

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmetaobjectbuilder.cpp
# Opt level: O2

void __thiscall QMetaMethodBuilder::setRevision(QMetaMethodBuilder *this,int revision)

{
  QMetaMethodBuilderPrivate *pQVar1;
  
  pQVar1 = d_func(this);
  if (pQVar1 != (QMetaMethodBuilderPrivate *)0x0) {
    pQVar1->revision = revision;
    pQVar1->attributes = (uint)(revision != 0) << 7 | pQVar1->attributes & 0xffffff7fU;
  }
  return;
}

Assistant:

void QMetaMethodBuilder::setRevision(int revision)
{
    QMetaMethodBuilderPrivate *d = d_func();
    if (d) {
        d->revision = revision;
        if (revision)
            d->attributes |= MethodRevisioned;
        else
            d->attributes &= ~MethodRevisioned;
    }
}